

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseBlockExpr(Parser *this)

{
  TokenType TVar1;
  undefined8 uVar2;
  bool bVar3;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  pointer __old_p;
  long *plVar4;
  long *plVar5;
  allocator<char> local_c9;
  undefined1 local_c8 [24];
  undefined1 local_b0 [8];
  undefined1 local_a8 [32];
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  local_88;
  undefined8 local_68;
  Token start;
  
  Token::Token(&start,&in_RSI->m_previous);
  local_88.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_a8);
  uVar2 = local_a8._0_8_;
  local_c8._8_8_ = local_a8._0_8_;
  if (start.type == EQUAL_GREATER) {
    parseExpr((Parser *)local_a8);
    local_c8._8_8_ = local_a8._0_8_;
    local_a8._0_8_ = (long *)0x0;
    if ((long *)uVar2 != (long *)0x0) {
      (**(code **)(*(long *)uVar2 + 8))(uVar2);
      if ((long *)local_a8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_a8._0_8_ + 8))();
      }
    }
  }
  else if (start.type == LEFT_BRACE) {
    plVar4 = (long *)local_a8._0_8_;
    local_68 = this;
    do {
      TVar1 = (in_RSI->m_current).type;
      if ((TVar1 == RIGHT_BRACE) || (TVar1 == END_OF_FILE)) break;
      parseStmt((Parser *)local_c8);
      bVar3 = consume(in_RSI,SEMICOLON);
      if (bVar3) {
        std::
        vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
        ::emplace_back<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>
                  ((vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
                    *)&local_88,
                   (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_c8);
        bVar3 = (in_RSI->m_current).type != RIGHT_BRACE;
        plVar5 = plVar4;
      }
      else {
        local_c8._16_8_ = local_c8._0_8_;
        local_c8._0_8_ = (CompileContext *)0x0;
        dynamic_unique_ptr_cast<enact::ExpressionStmt,enact::Stmt>
                  ((enact *)local_b0,
                   (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)(local_c8 + 0x10));
        if ((CompileContext *)local_c8._16_8_ != (CompileContext *)0x0) {
          (**(code **)((((string *)local_c8._16_8_)->_M_dataplus)._M_p + 8))();
        }
        local_c8._16_8_ = 0;
        if (local_b0 == (undefined1  [8])0x0) {
          __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,"Expected expression or \';\' at end of block.",&local_c9);
          error(__return_storage_ptr__,in_RSI,(string *)local_a8);
          __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        plVar5 = *(long **)((long)local_b0 + 8);
        *(long *)((long)local_b0 + 8) = 0;
        local_c8._8_8_ = plVar5;
        if (plVar4 == (long *)0x0) {
LAB_0010a082:
          (**(code **)(*(long *)local_b0 + 8))();
        }
        else {
          (**(code **)(*plVar4 + 8))(plVar4);
          if (local_b0 != (undefined1  [8])0x0) goto LAB_0010a082;
        }
        bVar3 = false;
      }
      if ((CompileContext *)local_c8._0_8_ != (CompileContext *)0x0) {
        (**(code **)((((string *)local_c8._0_8_)->_M_dataplus)._M_p + 8))();
      }
      plVar4 = plVar5;
    } while (bVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"Expected \'}\' at end of block.",(allocator<char> *)local_c8);
    expect(in_RSI,RIGHT_BRACE,(string *)local_a8);
    this = (Parser *)local_68;
    std::__cxx11::string::~string((string *)local_a8);
  }
  std::
  make_unique<enact::BlockExpr,std::vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
            ((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
              *)local_a8,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_88);
  this->m_context = local_a8._0_8_;
  if ((long *)local_c8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_c8._8_8_ + 8))();
  }
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::~string((string *)&start.lexeme);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (tuple<enact::Expr_*,_std::default_delete<enact::Expr>_>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBlockExpr() {
        Token start = m_previous;

        std::vector<std::unique_ptr<Stmt>> body{};
        std::unique_ptr<Expr> end{std::make_unique<UnitExpr>(m_previous)};

        if (start.type == TokenType::EQUAL_GREATER) {
            end = parseExpr();
        } else if (start.type == TokenType::LEFT_BRACE) {
            while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
                std::unique_ptr<Stmt> current = parseStmt();

                if (consume(TokenType::SEMICOLON)) {
                    body.push_back(std::move(current));
                    if (check(TokenType::RIGHT_BRACE)) break;
                } else {
                    if (auto exprStmt = dynamic_unique_ptr_cast<ExpressionStmt>(std::move(current))) {
                        end = std::move(exprStmt->expr);
                    } else {
                        throw error("Expected expression or ';' at end of block.");
                    }
                    break;
                }
            }

            expect(TokenType::RIGHT_BRACE, "Expected '}' at end of block.");
        }

        return std::make_unique<BlockExpr>(std::move(body), std::move(end));
    }